

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_ChangeVelocity
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  VMValue *pVVar1;
  AActor *pAVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  bool local_9b;
  double cosa;
  double sina;
  DVector3 vel;
  INTBOOL was_moving;
  AActor *ref;
  int ptr;
  int flags;
  double z;
  double y;
  double x;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x12c4,
                  "int AF_AActor_A_ChangeVelocity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar3) {
    pAVar2 = (AActor *)(param->field_0).field_1.a;
    local_9b = true;
    if (pAVar2 != (AActor *)0x0) {
      local_9b = DObject::IsKindOf((DObject *)pAVar2,AActor::RegistrationInfo.MyClass);
    }
    if (local_9b != false) {
      if (numparam < 2) {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
        if ((pVVar1->field_0).field_3.Type != '\x01') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x12c5,
                        "int AF_AActor_A_ChangeVelocity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
        y = (pVVar1->field_0).f;
      }
      else {
        if (param[1].field_0.field_3.Type != '\x01') {
          __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x12c5,
                        "int AF_AActor_A_ChangeVelocity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        y = param[1].field_0.f;
      }
      if (numparam < 3) {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
        if ((pVVar1->field_0).field_3.Type != '\x01') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x12c6,
                        "int AF_AActor_A_ChangeVelocity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
        z = (pVVar1->field_0).f;
      }
      else {
        if (param[2].field_0.field_3.Type != '\x01') {
          __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x12c6,
                        "int AF_AActor_A_ChangeVelocity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        z = param[2].field_0.f;
      }
      if (numparam < 4) {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
        if ((pVVar1->field_0).field_3.Type != '\x01') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x12c7,
                        "int AF_AActor_A_ChangeVelocity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
        _ptr = (pVVar1->field_0).f;
      }
      else {
        if (param[3].field_0.field_3.Type != '\x01') {
          __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x12c7,
                        "int AF_AActor_A_ChangeVelocity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        _ptr = param[3].field_0.f;
      }
      if (numparam < 5) {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
        if ((pVVar1->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x12c8,
                        "int AF_AActor_A_ChangeVelocity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
        ref._4_4_ = (pVVar1->field_0).i;
      }
      else {
        if (param[4].field_0.field_3.Type != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x12c8,
                        "int AF_AActor_A_ChangeVelocity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        ref._4_4_ = param[4].field_0.i;
      }
      if (numparam < 6) {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
        if ((pVVar1->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x12c9,
                        "int AF_AActor_A_ChangeVelocity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
        ref._0_4_ = (pVVar1->field_0).i;
      }
      else {
        if (param[5].field_0.field_3.Type != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x12c9,
                        "int AF_AActor_A_ChangeVelocity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        ref._0_4_ = param[5].field_0.i;
      }
      pAVar2 = COPY_AAPTR(pAVar2,(int)ref);
      if (pAVar2 != (AActor *)0x0) {
        bVar3 = TVector3<double>::isZero(&pAVar2->Vel);
        vel.Z._4_4_ = (uint)((bVar3 ^ 0xffU) & 1);
        TVector3<double>::TVector3((TVector3<double> *)&sina,y,z,_ptr);
        dVar4 = TAngle<double>::Sin(&(pAVar2->Angles).Yaw);
        dVar5 = TAngle<double>::Cos(&(pAVar2->Angles).Yaw);
        if ((ref._4_4_ & 1) != 0) {
          sina = y * dVar5 - z * dVar4;
          vel.X = y * dVar4 + z * dVar5;
        }
        if ((ref._4_4_ & 2) == 0) {
          TVector3<double>::operator+=(&pAVar2->Vel,(TVector3<double> *)&sina);
        }
        else {
          TVector3<double>::operator=(&pAVar2->Vel,(TVector3<double> *)&sina);
        }
        if (vel.Z._4_4_ != 0) {
          CheckStopped(pAVar2);
        }
      }
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x12c4,
                  "int AF_AActor_A_ChangeVelocity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x12c4,
                "int AF_AActor_A_ChangeVelocity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ChangeVelocity)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT_DEF	(x)		
	PARAM_FLOAT_DEF	(y)		
	PARAM_FLOAT_DEF	(z)		
	PARAM_INT_DEF	(flags)	
	PARAM_INT_DEF	(ptr)	

	AActor *ref = COPY_AAPTR(self, ptr);

	if (ref == NULL)
	{
		return 0;
	}

	INTBOOL was_moving = !ref->Vel.isZero();

	DVector3 vel(x, y, z);
	double sina = ref->Angles.Yaw.Sin();
	double cosa = ref->Angles.Yaw.Cos();

	if (flags & 1)	// relative axes - make x, y relative to actor's current angle
	{
		vel.X = x*cosa - y*sina;
		vel.Y = x*sina + y*cosa;
	}
	if (flags & 2)	// discard old velocity - replace old velocity with new velocity
	{
		ref->Vel = vel;
	}
	else	// add new velocity to old velocity
	{
		ref->Vel += vel;
	}

	if (was_moving)
	{
		CheckStopped(ref);
	}
	return 0;
}